

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen8CachePolicy.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx
          (GmmGen8CachePolicy *this,GMM_CACHE_POLICY_ELEMENT CachePolicy)

{
  GMM_CACHE_POLICY_ELEMENT CachePolicy_00;
  bool bVar1;
  GMM_PRIVATE_PAT *pGVar2;
  GMM_PRIVATE_PAT *pGVar3;
  uint32_t PATIdx_00;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  undefined8 extraout_RDX_00;
  byte local_64;
  byte local_60;
  byte local_5c;
  GMM_PRIVATE_PAT PAT2;
  GMM_PRIVATE_PAT PAT1;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  GMM_GFX_TARGET_CACHE local_2c;
  GMM_GFX_TARGET_CACHE WantedTC;
  GMM_GFX_MEMORY_TYPE MemoryType;
  GMM_GFX_MEMORY_TYPE WantedMemoryType;
  uint32_t PATIdx;
  uint32_t i;
  GmmGen8CachePolicy *this_local;
  
  MemoryType = GMM_GFX_UC_WITH_FENCE;
  WantedTC = GMM_GFX_TC_ELLC_ONLY;
  local_2c = GMM_GFX_TC_ELLC_LLC;
  _PATIdx = this;
  memcpy(&PAT2,&CachePolicy,0x28);
  CachePolicy_00.field_1 = (anon_union_8_2_649915e9_for_GMM_CACHE_POLICY_ELEMENT_REC_1)uStack_50;
  CachePolicy_00._0_8_ = _PAT2;
  CachePolicy_00.MemoryObjectOverride = (MEMORY_OBJECT_CONTROL_STATE)(undefined4)local_48;
  CachePolicy_00.field_3 =
       (anon_union_4_2_78ef2503_for_GMM_CACHE_POLICY_ELEMENT_REC_4)local_48._4_4_;
  CachePolicy_00.PTE = (GMM_PTE_CACHE_CONTROL_BITS)uStack_40;
  CachePolicy_00.Override = (undefined4)local_38;
  CachePolicy_00.IsOverridenByRegkey = local_38._4_4_;
  WantedTC = GmmCachePolicyCommon::GetWantedMemoryType
                       (&this->super_GmmCachePolicyCommon,CachePolicy_00);
  if ((((undefined1  [40])CachePolicy & (undefined1  [40])0x1) == (undefined1  [40])0x0) ||
     ((CachePolicy.field_1.Value >> 1 & 1) == 0)) {
    if (((undefined1  [40])CachePolicy & (undefined1  [40])0x1) == (undefined1  [40])0x0) {
      if ((CachePolicy.field_1.Value >> 1 & 1) != 0) {
        local_2c = GMM_GFX_TC_ELLC_ONLY;
      }
    }
    else {
      local_2c = GMM_GFX_TC_LLC_ONLY;
    }
  }
  else {
    local_2c = GMM_GFX_TC_ELLC_LLC;
  }
  uVar4 = extraout_RDX;
  for (WantedMemoryType = GMM_GFX_WC;
      WantedMemoryType < (this->super_GmmCachePolicyCommon).NumPATRegisters;
      WantedMemoryType = WantedMemoryType + GMM_GFX_WC) {
    pGVar2 = GetPrivatePATEntry((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)MemoryType,
                                (uint32_t)uVar4);
    pGVar3 = GetPrivatePATEntry((GMM_PRIVATE_PAT *)this,
                                (GmmGen8CachePolicy *)(ulong)WantedMemoryType,PATIdx_00);
    local_5c = (byte)pGVar2;
    local_60 = (byte)pGVar3;
    bVar1 = SelectNewPATIdx(this,WantedTC,local_2c,(uint)(local_5c & 3),(uint)(local_5c >> 2 & 3),
                            (uint)(local_60 & 3),(uint)(local_60 >> 2 & 3));
    if (bVar1) {
      MemoryType = WantedMemoryType;
    }
    uVar4 = extraout_RDX_00;
  }
  pGVar2 = GetPrivatePATEntry((GMM_PRIVATE_PAT *)this,(GmmGen8CachePolicy *)(ulong)MemoryType,
                              (uint32_t)uVar4);
  local_64 = (byte)pGVar2;
  if ((local_64 & 3) == WantedTC) {
    this_local._4_4_ = MemoryType;
  }
  else {
    this_local._4_4_ = ~GMM_GFX_UC_WITH_FENCE;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GmmLib::GmmGen8CachePolicy::BestMatchingPATIdx(GMM_CACHE_POLICY_ELEMENT CachePolicy)
{
    uint32_t             i;
    uint32_t             PATIdx           = 0;
    GMM_GFX_MEMORY_TYPE  WantedMemoryType = GMM_GFX_UC_WITH_FENCE, MemoryType;
    GMM_GFX_TARGET_CACHE WantedTC         = GMM_GFX_TC_ELLC_LLC;

    WantedMemoryType = GetWantedMemoryType(CachePolicy);

    if(CachePolicy.LLC && CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_LLC;
    }
    else if(CachePolicy.LLC)
    {
        WantedTC = GMM_GFX_TC_LLC_ONLY;
    }
    else if(CachePolicy.ELLC)
    {
        WantedTC = GMM_GFX_TC_ELLC_ONLY; // Note: this overrides the MOCS target cache selection.
    }

    for(i = 1; i < NumPATRegisters; i++)
    {
        GMM_PRIVATE_PAT PAT1 = GetPrivatePATEntry(PATIdx);
        GMM_PRIVATE_PAT PAT2 = GetPrivatePATEntry(i);

        if(SelectNewPATIdx(WantedMemoryType, WantedTC,
                           (GMM_GFX_MEMORY_TYPE)PAT1.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT1.PreGen10.TargetCache,
                           (GMM_GFX_MEMORY_TYPE)PAT2.PreGen10.MemoryType, (GMM_GFX_TARGET_CACHE)PAT2.PreGen10.TargetCache))
        {
            PATIdx = i;
        }
    }

    MemoryType = (GMM_GFX_MEMORY_TYPE)GetPrivatePATEntry(PATIdx).PreGen10.MemoryType;

    if(MemoryType != WantedMemoryType)
    {
        // Failed to find a matching PAT entry
        return GMM_PAT_ERROR;
    }
    return PATIdx;
}